

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testAddons.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  _Setw _Var3;
  reference pvVar4;
  ostream *poVar5;
  void *pvVar6;
  bool local_1b1;
  char *local_1a8;
  bool local_179;
  char *local_170;
  char *local_108;
  bool pass;
  bool local_6b;
  int gpuid;
  bool verbose;
  bool pass_all;
  bool debug;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char **argv_local;
  int argc_local;
  
  args.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)argv;
  stringArgs_abi_cxx11_
            ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gpuid,argc,argv);
  bVar2 = false;
  local_6b = false;
  while (bVar1 = std::
                 deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::empty((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&gpuid), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar4 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gpuid);
    bVar1 = std::operator==(pvVar4,"debug");
    if (bVar1) {
      bVar2 = true;
    }
    pvVar4 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gpuid);
    bVar1 = hasInfo(pvVar4);
    if (bVar1) {
      local_6b = true;
    }
    pvVar4 = std::
             deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gpuid);
    bVar1 = hasGpuID(pvVar4);
    if (bVar1) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gpuid);
      getGpuID((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gpuid);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gpuid);
  }
  if (bVar2) {
    debugTest();
    argv_local._4_4_ = 0;
  }
  else {
    std::operator<<((ostream *)&std::cout,"\n\n");
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "          Tasmanian Addons Module: Functionality Test");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------"
                            );
    pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    bVar2 = testConstructSurrogate(local_6b);
    _Var3 = std::setw(0x28);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar5 = std::operator<<(poVar5,"Automated construction");
    _Var3 = std::setw(10);
    poVar5 = std::operator<<(poVar5,_Var3);
    if (bVar2) {
      local_108 = "Pass";
    }
    else {
      local_108 = "FAIL";
    }
    poVar5 = std::operator<<(poVar5,local_108);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    _Var3 = std::setw(0x28);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar5 = std::operator<<(poVar5,"Unstructured construction");
    _Var3 = std::setw(10);
    poVar5 = std::operator<<(poVar5,_Var3);
    poVar5 = std::operator<<(poVar5,"skipping");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    bVar1 = testExoticQuadrature();
    _Var3 = std::setw(0x28);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar5 = std::operator<<(poVar5,"Exotic quadrature");
    _Var3 = std::setw(10);
    poVar5 = std::operator<<(poVar5,_Var3);
    if (bVar1) {
      local_170 = "Pass";
    }
    else {
      local_170 = "FAIL";
    }
    poVar5 = std::operator<<(poVar5,local_170);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_179 = false;
    if (bVar2) {
      local_179 = bVar1;
    }
    bVar2 = testCustomTabulated();
    _Var3 = std::setw(0x28);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
    poVar5 = std::operator<<(poVar5,"CustomTabulated manipulation");
    _Var3 = std::setw(10);
    poVar5 = std::operator<<(poVar5,_Var3);
    if (bVar2) {
      local_1a8 = "Pass";
    }
    else {
      local_1a8 = "FAIL";
    }
    poVar5 = std::operator<<(poVar5,local_1a8);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1b1 = false;
    if (local_179 != false) {
      local_1b1 = bVar2;
    }
    std::operator<<((ostream *)&std::cout,"\n");
    if (bVar2) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "---------------------------------------------------------------------"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "               All Tests Completed Successfully");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "---------------------------------------------------------------------"
                              );
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,"         Some Tests Have Failed");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL"
                              );
      pvVar6 = (void *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = (uint)(local_1b1 == false);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gpuid);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char const **argv){

    std::deque<std::string> args = stringArgs(argc, argv);

    bool debug = false;
    bool pass_all = true;
    bool verbose = false;
    int gpuid = -1;

    while(not args.empty()){
        if (args.front() == "debug") debug = true;
        if (hasInfo(args.front())) verbose = true;
        if (hasGpuID(args.front())){
            args.pop_front();
            gpuid = getGpuID(args);
        }
        args.pop_front();
    }

    if (debug){
        debugTest();
        return 0;
    }

    cout << "\n\n";
    cout << "---------------------------------------------------------------------" << endl;
    cout << "          Tasmanian Addons Module: Functionality Test" << endl;
    cout << "---------------------------------------------------------------------" << endl << endl;

    bool pass = testConstructSurrogate(verbose);
    cout << std::setw(40) << "Automated construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    #if defined(Tasmanian_ENABLE_BLAS) || defined(Tasmanian_ENABLE_GPU)
    pass = true;
    pass = testLoadUnstructuredL2(verbose, gpuid);
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;
    #else
    cout << std::setw(40) << "Unstructured construction" << std::setw(10) << "skipping" << endl;
    gpuid *= 2; // no op to register the use of gpuid
    #endif

    // Tests for Exotic Quadrature.
    pass = true;
    pass = testExoticQuadrature();
    cout << std::setw(40) << "Exotic quadrature" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    // Tests for manipulating CustomTabulated objects.
    pass = true;
    pass = testCustomTabulated();
    cout << std::setw(40) << "CustomTabulated manipulation" << std::setw(10) << ((pass) ? "Pass" : "FAIL") << endl;
    pass_all = pass_all && pass;

    cout << "\n";
    if (pass){
        cout << "---------------------------------------------------------------------" << endl;
        cout << "               All Tests Completed Successfully" << endl;
        cout << "---------------------------------------------------------------------" << endl << endl;
    }else{
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl;
        cout << "         Some Tests Have Failed" << endl;
        cout << "FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL FAIL" << endl << endl;
    }

    return ((pass_all) ? 0 : 1);

}